

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderJPG.cpp
# Opt level: O2

IImage * __thiscall irr::video::CImageLoaderJPG::loadImage(CImageLoaderJPG *this,IReadFile *file)

{
  u8 *puVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JOCTET *pJVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *data;
  void *pvVar5;
  IImage *this_00;
  u32 i;
  ulong uVar6;
  uint uVar7;
  dimension2d<unsigned_int> local_498;
  stringc filename;
  jpeg_source_mgr jsrc;
  undefined8 *local_438 [5];
  jpeg_source_mgr *local_410;
  uint local_408;
  uint local_404;
  int local_3fc;
  int local_3f8;
  undefined8 local_3e8;
  undefined4 local_3d4;
  uint local_3ac;
  int local_3a8;
  uint local_390;
  irr_jpeg_error_mgr jerr;
  
  if (file == (IReadFile *)0x0) {
    this_00 = (IImage *)0x0;
  }
  else {
    iVar2 = (*file->_vptr_IReadFile[4])(file);
    core::string<char>::string(&filename,(string<char> *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*file->_vptr_IReadFile[2])(file);
    pJVar4 = (JOCTET *)operator_new__(CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*file->_vptr_IReadFile[2])(file);
    (**file->_vptr_IReadFile)(file,pJVar4,CONCAT44(extraout_var_01,iVar2));
    local_438[0] = (undefined8 *)jpeg_std_error(&jerr);
    *local_438[0] = error_exit;
    local_438[0][2] = output_message;
    jerr.filename = &filename;
    iVar2 = _setjmp((__jmp_buf_tag *)jerr.setjmp_buffer);
    if (iVar2 == 0) {
      jpeg_CreateDecompress(local_438,0x50,0x290);
      iVar2 = (*file->_vptr_IReadFile[2])(file);
      jsrc.bytes_in_buffer = CONCAT44(extraout_var_02,iVar2);
      local_410 = &jsrc;
      jsrc.init_source = init_source;
      jsrc.fill_input_buffer = fill_input_buffer;
      jsrc.skip_input_data = skip_input_data;
      jsrc.resync_to_restart = jpeg_resync_to_restart;
      jsrc.term_source = term_source;
      jsrc.next_input_byte = pJVar4;
      jpeg_read_header(local_438,1);
      local_3f8 = (uint)(local_3fc == 4) * 2 + 2;
      local_3a8 = (local_3fc == 4) + 3;
      local_3e8 = 0x400199999999999a;
      local_3d4 = 0;
      if ((23000 < local_408) || (23000 < local_404)) {
        longjmp((__jmp_buf_tag *)jerr.setjmp_buffer,1);
      }
      jpeg_start_decompress(local_438);
      iVar2 = local_3a8 * local_408;
      data = operator_new__((ulong)(iVar2 * local_404));
      pvVar5 = operator_new__((ulong)local_404 * 8);
      uVar3 = 0;
      for (uVar6 = 0; local_404 != uVar6; uVar6 = uVar6 + 1) {
        *(ulong *)((long)pvVar5 + uVar6 * 8) = (ulong)uVar3 + (long)data;
        uVar3 = uVar3 + iVar2;
      }
      uVar6 = 0;
      while (local_390 < local_3ac) {
        iVar2 = jpeg_read_scanlines(local_438,(void *)((long)pvVar5 + uVar6 * 8),
                                    local_3ac - (int)uVar6);
        uVar6 = (ulong)(uint)(iVar2 + (int)uVar6);
      }
      operator_delete__(pvVar5);
      jpeg_finish_decompress(local_438);
      jpeg_destroy_decompress(local_438);
      this_00 = (IImage *)operator_new(0x50);
      if (local_3fc == 4) {
        local_498.Width = local_408;
        local_498.Height = local_404;
        CImage::CImage((CImage *)this_00,ECF_R8G8B8,&local_498);
        puVar1 = this_00->Data;
        if (puVar1 != (u8 *)0x0) {
          uVar3 = 1;
          for (uVar7 = 0; uVar7 < local_408 * local_404 * 3; uVar7 = uVar7 + 3) {
            uVar6 = (ulong)(uVar3 + 2);
            puVar1[uVar7] =
                 (u8)(int)(((float)*(byte *)((long)data + uVar6) / 255.0) *
                          (float)*(byte *)((long)data + (ulong)(uVar3 + 1)));
            puVar1[uVar7 + 1] =
                 (u8)(int)(((float)*(byte *)((long)data + uVar6) / 255.0) *
                          (float)*(byte *)((long)data + (ulong)uVar3));
            puVar1[uVar7 + 2] =
                 (u8)(int)(((float)*(byte *)((long)data + uVar6) / 255.0) *
                          (float)*(byte *)((long)data + (ulong)(uVar3 - 1)));
            uVar3 = uVar3 + 4;
          }
        }
        operator_delete__(data);
      }
      else {
        local_498.Width = local_408;
        local_498.Height = local_404;
        CImage::CImage((CImage *)this_00,ECF_R8G8B8,&local_498,data,true,true);
      }
      operator_delete__(pJVar4);
    }
    else {
      jpeg_destroy_decompress(local_438);
      operator_delete__(pJVar4);
      this_00 = (IImage *)0x0;
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return this_00;
}

Assistant:

IImage *CImageLoaderJPG::loadImage(io::IReadFile *file) const
{
	if (!file)
		return 0;

	core::stringc filename = file->getFileName();

	u8 **rowPtr = 0;
	u8 *input = new u8[file->getSize()];
	file->read(input, file->getSize());

	// allocate and initialize JPEG decompression object
	struct jpeg_decompress_struct cinfo;
	struct irr_jpeg_error_mgr jerr;

	// We have to set up the error handler first, in case the initialization
	// step fails.  (Unlikely, but it could happen if you are out of memory.)
	// This routine fills in the contents of struct jerr, and returns jerr's
	// address which we place into the link field in cinfo.

	cinfo.err = jpeg_std_error(&jerr.pub);
	cinfo.err->error_exit = error_exit;
	cinfo.err->output_message = output_message;
	jerr.filename = &filename;

	// compatibility fudge:
	// we need to use setjmp/longjmp for error handling as gcc-linux
	// crashes when throwing within external c code
	if (setjmp(jerr.setjmp_buffer)) {
		// If we get here, the JPEG code has signaled an error.
		// We need to clean up the JPEG object and return.

		jpeg_destroy_decompress(&cinfo);

		delete[] input;
		delete[] rowPtr;

		// return null pointer
		return 0;
	}

	// Now we can initialize the JPEG decompression object.
	jpeg_create_decompress(&cinfo);

	// specify data source
	jpeg_source_mgr jsrc;

	// Set up data pointer
	jsrc.bytes_in_buffer = file->getSize();
	jsrc.next_input_byte = (JOCTET *)input;
	cinfo.src = &jsrc;

	jsrc.init_source = init_source;
	jsrc.fill_input_buffer = fill_input_buffer;
	jsrc.skip_input_data = skip_input_data;
	jsrc.resync_to_restart = jpeg_resync_to_restart;
	jsrc.term_source = term_source;

	// Decodes JPG input from whatever source
	// Does everything AFTER jpeg_create_decompress
	// and BEFORE jpeg_destroy_decompress
	// Caller is responsible for arranging these + setting up cinfo

	// read file parameters with jpeg_read_header()
	jpeg_read_header(&cinfo, TRUE);

	bool useCMYK = false;
	if (cinfo.jpeg_color_space == JCS_CMYK) {
		cinfo.out_color_space = JCS_CMYK;
		cinfo.out_color_components = 4;
		useCMYK = true;
	} else {
		cinfo.out_color_space = JCS_RGB;
		cinfo.out_color_components = 3;
	}
	cinfo.output_gamma = 2.2;
	cinfo.do_fancy_upsampling = FALSE;

	// reject unreasonable sizes
	if (!checkImageDimensions(cinfo.image_width, cinfo.image_height))
		longjmp(jerr.setjmp_buffer, 1);

	// Start decompressor
	jpeg_start_decompress(&cinfo);

	// Get image data
	u32 rowspan = cinfo.image_width * cinfo.out_color_components;
	u32 width = cinfo.image_width;
	u32 height = cinfo.image_height;

	// Allocate memory for buffer
	u8 *output = new u8[rowspan * height];

	// Here we use the library's state variable cinfo.output_scanline as the
	// loop counter, so that we don't have to keep track ourselves.
	// Create array of row pointers for lib
	rowPtr = new u8 *[height];

	for (u32 i = 0; i < height; i++)
		rowPtr[i] = &output[i * rowspan];

	u32 rowsRead = 0;

	while (cinfo.output_scanline < cinfo.output_height)
		rowsRead += jpeg_read_scanlines(&cinfo, &rowPtr[rowsRead], cinfo.output_height - rowsRead);

	delete[] rowPtr;
	// Finish decompression

	jpeg_finish_decompress(&cinfo);

	// Release JPEG decompression object
	// This is an important step since it will release a good deal of memory.
	jpeg_destroy_decompress(&cinfo);

	// convert image
	IImage *image = 0;
	if (useCMYK) {
		image = new CImage(ECF_R8G8B8,
				core::dimension2d<u32>(width, height));
		const u32 size = 3 * width * height;
		u8 *data = (u8 *)image->getData();
		if (data) {
			for (u32 i = 0, j = 0; i < size; i += 3, j += 4) {
				// Also works without K, but has more contrast with K multiplied in
				//				data[i+0] = output[j+2];
				//				data[i+1] = output[j+1];
				//				data[i+2] = output[j+0];
				data[i + 0] = (char)(output[j + 2] * (output[j + 3] / 255.f));
				data[i + 1] = (char)(output[j + 1] * (output[j + 3] / 255.f));
				data[i + 2] = (char)(output[j + 0] * (output[j + 3] / 255.f));
			}
		}
		delete[] output;
	} else
		image = new CImage(ECF_R8G8B8,
				core::dimension2d<u32>(width, height), output);

	delete[] input;

	return image;
}